

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::iterate(IsTextureCase *this)

{
  int iVar1;
  deBool dVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  GetNameFunc local_240;
  int local_238;
  string local_230;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  GLenum local_184;
  GetNameFunc p_Stack_180;
  deUint32 err_1;
  int local_178;
  GetNameFunc local_170;
  int local_168;
  string local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  GLenum local_b4;
  GLuint local_b0;
  deUint32 err;
  GLuint textureId;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  IsTextureCase *this_local;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureId," // ERROR: ",(allocator<char> *)((long)&err + 3));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,(string *)&textureId);
  std::__cxx11::string::~string((string *)&textureId);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
  local_b0 = 0;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  glu::CallLogWrapper::glGenTextures
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_b0);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),this->m_target,local_b0);
  do {
    local_b4 = glu::CallLogWrapper::glGetError
                         ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_b4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Got Error ",&local_139);
      EVar4 = glu::getErrorStr(local_b4);
      p_Stack_180 = EVar4.m_getName;
      local_178 = EVar4.m_value;
      local_170 = p_Stack_180;
      local_168 = local_178;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_160,&local_170);
      std::operator+(&local_118,&local_138,&local_160);
      std::operator+(&local_f8,&local_118,": ");
      std::operator+(&local_d8,&local_f8,"glBindTexture");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateObjectBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             local_b0,true,QUERY_ISTEXTURE);
  glu::CallLogWrapper::glDeleteTextures
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_b0);
  do {
    local_184 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_184 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Got Error ",&local_209);
      EVar4 = glu::getErrorStr(local_184);
      local_240 = EVar4.m_getName;
      local_238 = EVar4.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_230,&local_240);
      std::operator+(&local_1e8,&local_208,&local_230);
      std::operator+(&local_1c8,&local_1e8,": ");
      std::operator+(&local_1a8,&local_1c8,"glDeleteTextures");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateObjectBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             local_b0,false,QUERY_ISTEXTURE);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,(this->super_TestCase).super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

IsTextureCase::IterateResult IsTextureCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	glw::GLuint				textureId	= 0;

	gl.enableLogging(true);

	gl.glGenTextures(1, &textureId);
	gl.glBindTexture(m_target, textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

	verifyStateObjectBoolean(result, gl, textureId, true, QUERY_ISTEXTURE);

	gl.glDeleteTextures(1, &textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");

	verifyStateObjectBoolean(result, gl, textureId, false, QUERY_ISTEXTURE);

	result.setTestContextResult(m_testCtx);
	return STOP;
}